

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.h
# Opt level: O0

void __thiscall
CppWebSpider::response::response
          (response *this,string *host,string *uri,string *content,CookieJar *cookie)

{
  long lVar1;
  string local_68 [35];
  allocator local_45 [20];
  allocator local_31;
  CookieJar *local_30;
  CookieJar *cookie_local;
  string *content_local;
  string *uri_local;
  string *host_local;
  response *this_local;
  
  this->status_code = -1;
  local_30 = cookie;
  cookie_local = (CookieJar *)content;
  content_local = uri;
  uri_local = host;
  host_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->protocol,"",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::string((string *)&this->host,(string *)host);
  std::__cxx11::string::string((string *)&this->uri,(string *)uri);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->content,"",local_45);
  std::allocator<char>::~allocator((allocator<char> *)local_45);
  memset(&this->headers,0,0x38);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&this->headers);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    std::__cxx11::string::string(local_68,(string *)content);
    parse(this,(string *)local_68,local_30);
    std::__cxx11::string::~string(local_68);
  }
  return;
}

Assistant:

response(std::string host,std::string uri,std::string content,CookieJar *cookie):status_code(-1),
														protocol(""),
														host(host),
														uri(uri),
														content(""),
														headers(std::unordered_map<std::string,std::string>())
		{
			//假如爬虫返回的原始的的http数据不为空才parse
			if(content.size()!=0)
				parse(content,cookie);
		}